

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O3

Vec_Int_t * Abc_FrameDeriveStatusArray(Vec_Ptr_t *vCexes)

{
  uint uVar1;
  void **ppvVar2;
  Vec_Int_t *pVVar3;
  int *__ptr;
  ulong uVar4;
  int iVar5;
  uint uVar6;
  size_t __size;
  ulong uVar7;
  
  if (vCexes == (Vec_Ptr_t *)0x0) {
    return (Vec_Int_t *)0x0;
  }
  uVar1 = vCexes->nSize;
  uVar7 = (ulong)uVar1;
  pVVar3 = (Vec_Int_t *)malloc(0x10);
  uVar6 = 0x10;
  if (0xe < uVar1 - 1) {
    uVar6 = uVar1;
  }
  pVVar3->nCap = uVar6;
  if (uVar6 == 0) {
    pVVar3->pArray = (int *)0x0;
    if ((int)uVar1 < 1) goto LAB_001ff07e;
    __size = uVar7 * 4;
LAB_001ff012:
    __ptr = (int *)malloc(__size);
LAB_001ff01a:
    pVVar3->pArray = __ptr;
    if (__ptr == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                    ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    pVVar3->nCap = uVar1;
  }
  else {
    __ptr = (int *)malloc((long)(int)uVar6 << 2);
    pVVar3->pArray = __ptr;
    if ((int)uVar6 < (int)uVar1) {
      __size = (long)(int)uVar1 << 2;
      if (__ptr == (int *)0x0) goto LAB_001ff012;
      __ptr = (int *)realloc(__ptr,__size);
      goto LAB_001ff01a;
    }
  }
  if (0 < (int)uVar1) {
    memset(__ptr,0xff,uVar7 * 4);
    iVar5 = vCexes->nSize;
    pVVar3->nSize = uVar1;
    if (iVar5 < 1) {
      return pVVar3;
    }
    ppvVar2 = vCexes->pArray;
    uVar4 = 0;
    do {
      if (ppvVar2[uVar4] != (void *)0x0) {
        if (uVar7 <= uVar4) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                        ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        __ptr[uVar4] = 0;
        iVar5 = vCexes->nSize;
      }
      uVar4 = uVar4 + 1;
    } while ((long)uVar4 < (long)iVar5);
    return pVVar3;
  }
LAB_001ff07e:
  pVVar3->nSize = uVar1;
  return pVVar3;
}

Assistant:

Vec_Int_t * Abc_FrameDeriveStatusArray( Vec_Ptr_t * vCexes )
{
    Vec_Int_t * vStatuses;
    Abc_Cex_t * pCex;
    int i;
    if ( vCexes == NULL )
        return NULL;
    vStatuses = Vec_IntAlloc( Vec_PtrSize(vCexes) );
    Vec_IntFill( vStatuses, Vec_PtrSize(vCexes), -1 ); // assume UNDEC
    Vec_PtrForEachEntry( Abc_Cex_t *, vCexes, pCex, i )
        if ( pCex != NULL )
            Vec_IntWriteEntry( vStatuses, i, 0 ); // set this output as SAT
    return vStatuses;    
}